

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall Liby::Socket::Socket(Socket *this,fdPtr *fp,bool isUdp_)

{
  int iVar1;
  element_type *this_00;
  bool isUdp__local;
  fdPtr *fp_local;
  Socket *this_local;
  
  this->isUdp_ = isUdp_;
  this_00 = std::__shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)fp);
  iVar1 = FileDescriptor::fd(this_00);
  this->fd_ = iVar1;
  std::shared_ptr<Liby::FileDescriptor>::shared_ptr(&this->fp_,fp);
  Endpoint::Endpoint(&this->ep_,0,0);
  return;
}

Assistant:

Socket::Socket(const fdPtr &fp, bool isUdp_)
    : isUdp_(isUdp_), fd_(fp->fd()), fp_(fp) {}